

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-fight-attack.c
# Opt level: O2

wchar_t borg_attack_aux_staff_dispel(wchar_t sval,wchar_t rad,wchar_t dam,wchar_t typ)

{
  _Bool _Var1;
  uint32_t uVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  
  wVar4 = L'\0';
  wVar3 = L'\0';
  if (((borg.trait[0x70] == 0) && (wVar3 = wVar4, borg.trait[0x72] == 0)) && (borg.trait[0x78] == 0)
     ) {
    if ((borg_simulate) && (uVar2 = Rand_div(100), (int)uVar2 < 2)) {
      return L'\0';
    }
    _Var1 = borg_equips_staff_fail(sval);
    if (_Var1) {
      wVar3 = borg_launch_bolt(L'\n',rad,dam,(uint)z_info->max_range,L'\0');
      wVar3 = wVar3 + L'\xffffffce';
      if (borg_simulate == false) {
        borg_use_staff(sval);
      }
    }
  }
  return wVar3;
}

Assistant:

static int borg_attack_aux_staff_dispel(int sval, int rad, int dam, int typ)
{
    int b_n;

    /* No firing while blind, confused, or hallucinating */
    if (borg.trait[BI_ISBLIND] || borg.trait[BI_ISCONFUSED]
        || borg.trait[BI_ISIMAGE])
        return 0;

    /* Paranoia */
    if (borg_simulate && (randint0(100) < 2))
        return 0;

    /* look for the staff */
    if (!borg_equips_staff_fail(sval))
        return 0;

    /* Choose optimal location--radius defined as 10 */
    b_n = borg_launch_bolt(10, dam, typ, z_info->max_range, 0);

    /* Big Penalize charge usage */
    b_n = b_n - 50;

    /* Simulation */
    if (borg_simulate)
        return b_n;

    /* Cast the prayer */
    (void)borg_use_staff(sval);

    /* Value */
    return b_n;
}